

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::compileConst(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader source;
  Reader source_00;
  Builder target;
  Reader type;
  ImplicitParams implicitMethodParams;
  undefined1 auVar1 [40];
  Builder target_00;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Builder typeBuilder;
  undefined1 uStack_149;
  undefined4 uStack_144;
  PointerReader local_138;
  StructBuilder local_110;
  StructBuilder local_e8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  StructReader local_90;
  StructReader local_60;
  
  local_138.pointer = builder._builder.pointers + 3;
  local_138.segment = &(builder._builder.segment)->super_SegmentReader;
  local_138.capTable = &(builder._builder.capTable)->super_CapTableReader;
  _::PointerBuilder::initStruct(&local_110,(PointerBuilder *)&local_138,(StructSize)0x10003);
  local_138.pointer = decl._reader.pointers + 5;
  if (decl._reader.pointerCount < 6) {
    local_138.pointer = (WirePointer *)0x0;
  }
  uVar3 = decl._reader.segment._0_4_;
  uVar4 = decl._reader.segment._4_4_;
  uVar5 = decl._reader.capTable._0_4_;
  uVar6 = decl._reader.capTable._4_4_;
  local_138.nestingLimit = decl._reader.nestingLimit;
  if (decl._reader.pointerCount < 6) {
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    local_138.nestingLimit = 0x7fffffff;
  }
  local_138.segment = (SegmentReader *)CONCAT44(uVar4,uVar3);
  local_138.capTable = (CapTableReader *)CONCAT44(uVar6,uVar5);
  _::PointerReader::getStruct(&local_60,&local_138,(word *)0x0);
  implicitMethodParams.params.reader._44_4_ = uStack_144;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = uStack_149;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  source._reader.capTable = local_60.capTable;
  source._reader.segment = local_60.segment;
  source._reader.data = local_60.data;
  source._reader.pointers = local_60.pointers;
  source._reader.dataSize = local_60.dataSize;
  source._reader.pointerCount = local_60.pointerCount;
  source._reader._38_2_ = local_60._38_2_;
  source._reader.nestingLimit = local_60.nestingLimit;
  source._reader._44_4_ = local_60._44_4_;
  target._builder.capTable = local_110.capTable;
  target._builder.segment = local_110.segment;
  target._builder.data = local_110.data;
  target._builder.pointers = local_110.pointers;
  target._builder.dataSize = local_110.dataSize;
  target._builder.pointerCount = local_110.pointerCount;
  target._builder._38_2_ = local_110._38_2_;
  auVar1 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar1._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar1._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar1._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar1._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar1._32_4_;
  implicitMethodParams.params.reader.step = auVar1._36_4_;
  bVar2 = compileType(this,source,target,implicitMethodParams);
  if (bVar2) {
    local_138.pointer = decl._reader.pointers + 6;
    if (decl._reader.pointerCount < 7) {
      local_138.pointer = (WirePointer *)0x0;
    }
    local_138.nestingLimit = decl._reader.nestingLimit;
    if (decl._reader.pointerCount < 7) {
      decl._reader.segment._0_4_ = 0;
      decl._reader.segment._4_4_ = 0;
      decl._reader.capTable._0_4_ = 0;
      decl._reader.capTable._4_4_ = 0;
      local_138.nestingLimit = 0x7fffffff;
    }
    local_138.segment =
         (SegmentReader *)CONCAT44(decl._reader.segment._4_4_,decl._reader.segment._0_4_);
    local_138.capTable =
         (CapTableReader *)CONCAT44(decl._reader.capTable._4_4_,decl._reader.capTable._0_4_);
    _::PointerReader::getStruct(&local_90,&local_138,(word *)0x0);
    _::StructBuilder::asReader(&local_110);
    local_138.pointer = builder._builder.pointers + 4;
    local_138.segment = &(builder._builder.segment)->super_SegmentReader;
    local_138.capTable = &(builder._builder.capTable)->super_CapTableReader;
    _::PointerBuilder::initStruct(&local_e8,(PointerBuilder *)&local_138,(StructSize)0x10002);
    source_00._reader.capTable = local_90.capTable;
    source_00._reader.segment = local_90.segment;
    source_00._reader.data = local_90.data;
    source_00._reader.pointers = local_90.pointers;
    source_00._reader.dataSize = local_90.dataSize;
    source_00._reader.pointerCount = local_90.pointerCount;
    source_00._reader._38_2_ = local_90._38_2_;
    source_00._reader.nestingLimit = local_90.nestingLimit;
    source_00._reader._44_4_ = local_90._44_4_;
    type._reader.capTable = (CapTableReader *)uStack_b8;
    type._reader.segment = (SegmentReader *)local_c0;
    type._reader.data = (void *)local_b0;
    type._reader.pointers = (WirePointer *)uStack_a8;
    type._reader.dataSize = (undefined4)local_a0;
    type._reader.pointerCount = local_a0._4_2_;
    type._reader._38_2_ = local_a0._6_2_;
    type._reader._40_8_ = uStack_98;
    target_00._builder.capTable = local_e8.capTable;
    target_00._builder.segment = local_e8.segment;
    target_00._builder.data = local_e8.data;
    target_00._builder.pointers = local_e8.pointers;
    target_00._builder.dataSize = local_e8.dataSize;
    target_00._builder.pointerCount = local_e8.pointerCount;
    target_00._builder._38_2_ = local_e8._38_2_;
    compileBootstrapValue(this,source_00,type,target_00,(Schema)0x207c40);
  }
  return;
}

Assistant:

void NodeTranslator::compileConst(Declaration::Const::Reader decl,
                                  schema::Node::Const::Builder builder) {
  auto typeBuilder = builder.initType();
  if (compileType(decl.getType(), typeBuilder, noImplicitParams())) {
    compileBootstrapValue(decl.getValue(), typeBuilder.asReader(), builder.initValue());
  }
}